

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  uint uVar1;
  FSE_repeat FVar2;
  U32 UVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uint local_1bc;
  uint local_1ac;
  U32 u;
  U32 maxOffset;
  U32 offcodeMax;
  size_t dictContentSize;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t offcodeHeaderSize;
  size_t sStack_a0;
  uint offcodeLog;
  size_t hufHeaderSize;
  uint hasZeroWeights;
  uint maxSymbolValue;
  BYTE *dictEnd;
  BYTE *dictPtr;
  short local_78 [2];
  uint offcodeMaxValue;
  short offcodeNCount [32];
  size_t dictSize_local;
  void *dict_local;
  void *workspace_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  dictPtr._4_4_ = 0x1f;
  _hasZeroWeights = (BYTE *)((long)dict + dictSize);
  dictEnd = (BYTE *)((long)dict + 8);
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  hufHeaderSize._4_4_ = 0xff;
  hufHeaderSize._0_4_ = 1;
  sStack_a0 = HUF_readCTable((HUF_CElt *)bs,(uint *)((long)&hufHeaderSize + 4),dictEnd,
                             (long)_hasZeroWeights - (long)dictEnd,(uint *)&hufHeaderSize);
  if ((int)hufHeaderSize == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  uVar1 = ERR_isError(sStack_a0);
  if (uVar1 == 0) {
    if (hufHeaderSize._4_4_ < 0xff) {
      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
    }
    else {
      dictEnd = dictEnd + sStack_a0;
      sVar4 = FSE_readNCount(local_78,(uint *)((long)&dictPtr + 4),
                             (uint *)((long)&offcodeHeaderSize + 4),dictEnd,
                             (long)_hasZeroWeights - (long)dictEnd);
      uVar1 = ERR_isError(sVar4);
      if (uVar1 == 0) {
        if (offcodeHeaderSize._4_4_ < 9) {
          sVar5 = FSE_buildCTable_wksp
                            ((bs->entropy).fse.offcodeCTable,local_78,0x1f,offcodeHeaderSize._4_4_,
                             workspace,0x1900);
          uVar1 = ERR_isError(sVar5);
          if (uVar1 == 0) {
            dictEnd = dictEnd + sVar4;
            matchlengthHeaderSize._4_4_ = 0x34;
            sVar4 = FSE_readNCount((short *)&matchlengthLog,
                                   (uint *)((long)&matchlengthHeaderSize + 4),
                                   (uint *)&matchlengthHeaderSize,dictEnd,
                                   (long)_hasZeroWeights - (long)dictEnd);
            uVar1 = ERR_isError(sVar4);
            if (uVar1 == 0) {
              if ((uint)matchlengthHeaderSize < 10) {
                sVar5 = FSE_buildCTable_wksp
                                  ((bs->entropy).fse.matchlengthCTable,(short *)&matchlengthLog,
                                   matchlengthHeaderSize._4_4_,(uint)matchlengthHeaderSize,workspace
                                   ,0x1900);
                uVar1 = ERR_isError(sVar5);
                if (uVar1 == 0) {
                  FVar2 = ZSTD_dictNCountRepeat
                                    ((short *)&matchlengthLog,matchlengthHeaderSize._4_4_,0x34);
                  (bs->entropy).fse.matchlength_repeatMode = FVar2;
                  dictEnd = dictEnd + sVar4;
                  litlengthHeaderSize._4_4_ = 0x23;
                  sVar4 = FSE_readNCount((short *)&litlengthLog,
                                         (uint *)((long)&litlengthHeaderSize + 4),
                                         (uint *)&litlengthHeaderSize,dictEnd,
                                         (long)_hasZeroWeights - (long)dictEnd);
                  uVar1 = ERR_isError(sVar4);
                  if (uVar1 == 0) {
                    if ((uint)litlengthHeaderSize < 10) {
                      sVar5 = FSE_buildCTable_wksp
                                        ((bs->entropy).fse.litlengthCTable,(short *)&litlengthLog,
                                         litlengthHeaderSize._4_4_,(uint)litlengthHeaderSize,
                                         workspace,0x1900);
                      uVar1 = ERR_isError(sVar5);
                      if (uVar1 == 0) {
                        FVar2 = ZSTD_dictNCountRepeat
                                          ((short *)&litlengthLog,litlengthHeaderSize._4_4_,0x23);
                        (bs->entropy).fse.litlength_repeatMode = FVar2;
                        dictEnd = dictEnd + sVar4;
                        if (_hasZeroWeights < dictEnd + 0xc) {
                          bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                        }
                        else {
                          UVar3 = MEM_readLE32(dictEnd);
                          bs->rep[0] = UVar3;
                          UVar3 = MEM_readLE32(dictEnd + 4);
                          bs->rep[1] = UVar3;
                          UVar3 = MEM_readLE32(dictEnd + 8);
                          bs->rep[2] = UVar3;
                          dictEnd = dictEnd + 0xc;
                          uVar6 = (long)_hasZeroWeights - (long)dictEnd;
                          u = 0x1f;
                          if (uVar6 < 0xfffe0000) {
                            u = ZSTD_highbit32((int)uVar6 + 0x20000);
                          }
                          if (u < 0x1f) {
                            local_1bc = u;
                          }
                          else {
                            local_1bc = 0x1f;
                          }
                          FVar2 = ZSTD_dictNCountRepeat(local_78,dictPtr._4_4_,local_1bc);
                          (bs->entropy).fse.offcode_repeatMode = FVar2;
                          for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
                            if (bs->rep[local_1ac] == 0) {
                              return 0xffffffffffffffe2;
                            }
                            if (uVar6 < bs->rep[local_1ac]) {
                              return 0xffffffffffffffe2;
                            }
                          }
                          bs_local = (ZSTD_compressedBlockState_t *)(dictEnd + -(long)dict);
                        }
                      }
                      else {
                        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                      }
                    }
                    else {
                      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                    }
                  }
                  else {
                    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                  }
                }
                else {
                  bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                }
              }
              else {
                bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
              }
            }
            else {
              bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
            }
          }
          else {
            bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
          }
        }
        else {
          bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
        }
      }
      else {
        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
      }
    }
  }
  else {
    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
  }
  return (size_t)bs_local;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}